

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

void Gia_RsbPrint(Gia_RsbMan_t *p)

{
  Vec_Int_t *p_00;
  int iVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint local_4c;
  Vec_Int_t *vLevel [2];
  
  uVar3 = p->vObjs->nSize;
  iVar1 = 1 << ((byte)uVar3 & 0x1f);
  if (p->vSets[0]->nSize != iVar1) {
    __assert_fail("Vec_WecSize(p->vSets[0]) == nLeaves",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                  ,0x5a7,"void Gia_RsbPrint(Gia_RsbMan_t *)");
  }
  if (p->vSets[1]->nSize == iVar1) {
    uVar2 = Gia_RsbCost(p);
    printf("Database for %d objects and cost %d:\n",(ulong)uVar3,(ulong)uVar2);
    local_4c = 0;
    while( true ) {
      if (p->vSets[0]->nSize <= (int)local_4c) break;
      vLevel[0] = Vec_WecEntry(p->vSets[0],local_4c);
      vLevel[1] = Vec_WecEntry(p->vSets[1],local_4c);
      uVar4 = 0;
      while( true ) {
        if (uVar4 == 2) break;
        printf("%5d : ");
        Extra_PrintBinary2(_stdout,&local_4c,p->vObjs->nSize);
        printf(" %d ",uVar4 & 0xffffffff);
        p_00 = vLevel[uVar4];
        printf("Vector has %d entries: {",(ulong)(uint)p_00->nSize);
        for (iVar1 = 0; iVar1 < p_00->nSize; iVar1 = iVar1 + 1) {
          uVar3 = Vec_IntEntry(p_00,iVar1);
          printf(" %d",(ulong)uVar3);
        }
        puts(" }");
        uVar4 = uVar4 + 1;
      }
      local_4c = local_4c + 1;
    }
    return;
  }
  __assert_fail("Vec_WecSize(p->vSets[1]) == nLeaves",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                ,0x5a8,"void Gia_RsbPrint(Gia_RsbMan_t *)");
}

Assistant:

void Gia_RsbPrint( Gia_RsbMan_t * p )
{
    Vec_Int_t * vLevel[2]; 
    int n, i, nLeaves = 1 << Vec_IntSize(p->vObjs);
    assert( Vec_WecSize(p->vSets[0]) == nLeaves );
    assert( Vec_WecSize(p->vSets[1]) == nLeaves );
    printf( "Database for %d objects and cost %d:\n", Vec_IntSize(p->vObjs), Gia_RsbCost(p) );
    Vec_WecForEachLevelTwo( p->vSets[0], p->vSets[1], vLevel[0], vLevel[1], i )
    {
        for ( n = 0; n < 2; n++ )
        {
            printf( "%5d : ", i );
            Extra_PrintBinary2( stdout, (unsigned*)&i, Vec_IntSize(p->vObjs) ); printf( " %d ", n );
            Vec_IntPrint( vLevel[n] );
        }
    }    
}